

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O3

bool __thiscall
soplex::
SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::maxReEnter(SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *sel,
            number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *maxabs,SPxId *id,int nr,bool polish)

{
  uint *puVar1;
  int iVar2;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar3;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar4;
  Item *pIVar5;
  pointer pnVar6;
  undefined8 uVar7;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar8;
  undefined8 uVar9;
  int iVar10;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar11;
  cpp_dec_float<50U,_int,_void> *pcVar12;
  pointer pnVar13;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar14;
  long lVar15;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar16;
  uint uVar17;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar18;
  fpclass_type fVar19;
  int32_t iVar20;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_4;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_168;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_158;
  cpp_dec_float<50U,_int,_void> local_118;
  cpp_dec_float<50U,_int,_void> *local_e0;
  cpp_dec_float<50U,_int,_void> local_d8;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_a0;
  long local_98;
  int local_8c;
  cpp_dec_float<50U,_int,_void> local_88;
  cpp_dec_float<50U,_int,_void> *local_50;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_48;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_40;
  SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_38;
  
  local_118.fpclass = cpp_dec_float_finite;
  local_118.prec_elem = 10;
  local_118.data._M_elems[0] = 0;
  local_118.data._M_elems[1] = 0;
  local_118.data._M_elems[2] = 0;
  local_118.data._M_elems[3] = 0;
  local_118.data._M_elems[4] = 0;
  local_118.data._M_elems[5] = 0;
  local_118.data._M_elems._24_5_ = 0;
  local_118.data._M_elems[7]._1_3_ = 0;
  local_118.data._M_elems._32_5_ = 0;
  local_118.data._M_elems[9]._1_3_ = 0;
  local_118.exp = 0;
  local_118.neg = false;
  local_88.fpclass = cpp_dec_float_finite;
  local_88.prec_elem = 10;
  local_88.data._M_elems[0] = 0;
  local_88.data._M_elems[1] = 0;
  local_88.data._M_elems[2] = 0;
  local_88.data._M_elems[3] = 0;
  local_88.data._M_elems[4] = 0;
  local_88.data._M_elems[5] = 0;
  local_88.data._M_elems._24_5_ = 0;
  local_88.data._M_elems[7]._1_3_ = 0;
  local_88.data._M_elems._32_5_ = 0;
  local_88.data._M_elems[9]._1_3_ = 0;
  local_88.exp = 0;
  local_88.neg = false;
  pSVar3 = (this->
           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  pUVar16 = pSVar3->thePvec;
  this_00 = &pUVar16->thedelta;
  pUVar4 = pSVar3->theCoPvec;
  iVar10 = (id->super_DataKey).info * pSVar3->theRep;
  local_e0 = &sel->m_backend;
  local_50 = &maxabs->m_backend;
  if (iVar10 < 0) {
    lVar15 = (long)nr;
    if (0 < pSVar3->theRep *
            ((pSVar3->
             super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thedesc.costat)->data[lVar15]) {
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::clearIdx(&pUVar4->thedelta,nr);
      return true;
    }
    pVVar18 = pSVar3->theCoUbound;
    local_168 = pSVar3->theCoLbound;
    pnVar13 = (pUVar4->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_118.data._M_elems._32_5_ = SUB85(*(undefined8 *)((long)(pnVar13 + lVar15) + 0x20),0);
    local_118.data._M_elems[9]._1_3_ =
         (undefined3)((ulong)*(undefined8 *)((long)(pnVar13 + lVar15) + 0x20) >> 0x28);
    local_118.data._M_elems._0_8_ = *(undefined8 *)&pnVar13[lVar15].m_backend;
    local_118.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar13[lVar15].m_backend + 8);
    local_118.data._M_elems._16_8_ = *(undefined8 *)((long)(pnVar13 + lVar15) + 0x10);
    uVar9 = *(undefined8 *)((long)(pnVar13 + lVar15) + 0x18);
    local_118.data._M_elems._24_5_ = SUB85(uVar9,0);
    local_118.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar9 >> 0x28);
    local_118.exp = *(int *)((long)(pnVar13 + lVar15) + 0x28);
    local_118.neg = *(bool *)((long)(pnVar13 + lVar15) + 0x2c);
    local_118._48_8_ = *(undefined8 *)((long)(pnVar13 + lVar15) + 0x30);
    pnVar6 = (pUVar4->thedelta).
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_88.exp = pnVar6[lVar15].m_backend.exp;
    local_88.neg = pnVar6[lVar15].m_backend.neg;
    local_88.fpclass = pnVar6[lVar15].m_backend.fpclass;
    local_88.prec_elem = pnVar6[lVar15].m_backend.prec_elem;
    local_88.data._M_elems._0_8_ = *(undefined8 *)&pnVar6[lVar15].m_backend.data;
    local_88.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar6[lVar15].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar6[lVar15].m_backend.data + 0x10);
    local_88.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    uVar7 = *(undefined8 *)(puVar1 + 2);
    uVar9 = *(undefined8 *)((long)&pnVar6[lVar15].m_backend.data + 0x20);
    local_88.data._M_elems._32_5_ = SUB85(uVar9,0);
    local_88.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar9 >> 0x28);
    local_88.data._M_elems._24_5_ = SUB85(uVar7,0);
    local_88.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
    local_98 = lVar15;
    if (local_88.fpclass == cpp_dec_float_NaN) {
LAB_002b783c:
      pNVar11 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)(pnVar13 + lVar15);
      pNVar14 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)((pVVar18->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar15);
      local_158.val.m_backend.fpclass = cpp_dec_float_finite;
      local_158.val.m_backend.prec_elem = 10;
      local_158.val.m_backend.data._M_elems[0] = 0;
      local_158.val.m_backend.data._M_elems[1] = 0;
      local_158.val.m_backend.data._M_elems[2] = 0;
      local_158.val.m_backend.data._M_elems[3] = 0;
      local_158.val.m_backend.data._M_elems[4] = 0;
      local_158.val.m_backend.data._M_elems[5] = 0;
      local_158.val.m_backend.data._M_elems._24_5_ = 0;
      local_158.val.m_backend.data._M_elems[7]._1_3_ = 0;
      local_158.val.m_backend.data._M_elems._32_5_ = 0;
      local_158.val.m_backend.data._M_elems[9]._1_3_ = 0;
      local_158.val.m_backend.exp = 0;
      local_158.val.m_backend.neg = false;
      if (&local_158 == pNVar11) {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  ((cpp_dec_float<50U,_int,_void> *)&local_158,
                   (cpp_dec_float<50U,_int,_void> *)pNVar14);
        pcVar12 = local_e0;
        if (local_158.val.m_backend.data._M_elems[0] != 0 ||
            local_158.val.m_backend.fpclass != cpp_dec_float_finite) {
LAB_002b78cb:
          local_158.val.m_backend.neg = (bool)(local_158.val.m_backend.neg ^ 1);
        }
      }
      else {
        if (&local_158 != pNVar14) goto LAB_002b7870;
LAB_002b79aa:
        local_158.val.m_backend.fpclass = cpp_dec_float_finite;
        local_158.val.m_backend.prec_elem = 10;
        local_158.val.m_backend.neg = false;
        local_158.val.m_backend.exp = 0;
        local_158.val.m_backend.data._M_elems[9]._1_3_ = 0;
        local_158.val.m_backend.data._M_elems._32_5_ = 0;
        local_158.val.m_backend.data._M_elems[7]._1_3_ = 0;
        local_158.val.m_backend.data._M_elems._24_5_ = 0;
        local_158.val.m_backend.data._M_elems[4] = 0;
        local_158.val.m_backend.data._M_elems[5] = 0;
        local_158.val.m_backend.data._M_elems[2] = 0;
        local_158.val.m_backend.data._M_elems[3] = 0;
        local_158.val.m_backend.data._M_elems[0] = 0;
        local_158.val.m_backend.data._M_elems[1] = 0;
LAB_002b79af:
        pcVar12 = local_e0;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  ((cpp_dec_float<50U,_int,_void> *)&local_158,
                   (cpp_dec_float<50U,_int,_void> *)pNVar11);
      }
    }
    else {
      local_d8.fpclass = cpp_dec_float_finite;
      local_d8.prec_elem = 10;
      local_d8.data._M_elems[0] = 0;
      local_d8.data._M_elems[1] = 0;
      local_d8.data._M_elems[2] = 0;
      local_d8.data._M_elems[3] = 0;
      local_d8.data._M_elems[4] = 0;
      local_d8.data._M_elems[5] = 0;
      local_d8.data._M_elems._24_5_ = 0;
      local_d8.data._M_elems[7]._1_3_ = 0;
      local_d8.data._M_elems._32_5_ = 0;
      local_d8.data._M_elems[9]._1_3_ = 0;
      local_d8.exp = 0;
      local_d8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_d8,0.0);
      iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         (&local_88,&local_d8);
      pcVar12 = local_e0;
      pnVar13 = (pUVar4->
                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (-1 < iVar10) goto LAB_002b783c;
      pNVar11 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)(pnVar13 + lVar15);
      pNVar14 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)((local_168->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar15);
      local_158.val.m_backend.fpclass = cpp_dec_float_finite;
      local_158.val.m_backend.prec_elem = 10;
      local_158.val.m_backend.data._M_elems[0] = 0;
      local_158.val.m_backend.data._M_elems[1] = 0;
      local_158.val.m_backend.data._M_elems[2] = 0;
      local_158.val.m_backend.data._M_elems[3] = 0;
      local_158.val.m_backend.data._M_elems[4] = 0;
      local_158.val.m_backend.data._M_elems[5] = 0;
      local_158.val.m_backend.data._M_elems._24_5_ = 0;
      local_158.val.m_backend.data._M_elems[7]._1_3_ = 0;
      local_158.val.m_backend.data._M_elems._32_5_ = 0;
      local_158.val.m_backend.data._M_elems[9]._1_3_ = 0;
      local_158.val.m_backend.exp = 0;
      local_158.val.m_backend.neg = false;
      if (&local_158 != pNVar11) {
        if (&local_158 == pNVar14) goto LAB_002b79aa;
LAB_002b7870:
        uVar9 = *(undefined8 *)((long)(pNVar14->val).m_backend.data._M_elems + 0x20);
        local_158.val.m_backend.data._M_elems._32_5_ = SUB85(uVar9,0);
        local_158.val.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar9 >> 0x28);
        local_158.val.m_backend.data._M_elems._0_8_ =
             *(undefined8 *)(pNVar14->val).m_backend.data._M_elems;
        local_158.val.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((long)(pNVar14->val).m_backend.data._M_elems + 8);
        local_158.val.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((long)(pNVar14->val).m_backend.data._M_elems + 0x10);
        uVar9 = *(undefined8 *)((long)(pNVar14->val).m_backend.data._M_elems + 0x18);
        local_158.val.m_backend.data._M_elems._24_5_ = SUB85(uVar9,0);
        local_158.val.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar9 >> 0x28);
        local_158.val.m_backend.exp = *(int *)((long)&(pNVar14->val).m_backend + 0x28);
        local_158.val.m_backend.neg = *(bool *)((long)&(pNVar14->val).m_backend + 0x2c);
        local_158.val.m_backend._48_8_ = *(undefined8 *)((long)&(pNVar14->val).m_backend + 0x30);
        goto LAB_002b79af;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                ((cpp_dec_float<50U,_int,_void> *)&local_158,
                 (cpp_dec_float<50U,_int,_void> *)pNVar14);
      if (local_158.val.m_backend.data._M_elems[0] != 0 ||
          local_158.val.m_backend.fpclass != cpp_dec_float_finite) goto LAB_002b78cb;
    }
    local_d8.fpclass = cpp_dec_float_finite;
    local_d8.prec_elem = 10;
    local_d8.data._M_elems[0] = 0;
    local_d8.data._M_elems[1] = 0;
    local_d8.data._M_elems[2] = 0;
    local_d8.data._M_elems[3] = 0;
    local_d8.data._M_elems[4] = 0;
    local_d8.data._M_elems[5] = 0;
    local_d8.data._M_elems._24_5_ = 0;
    local_d8.data._M_elems[7]._1_3_ = 0;
    local_d8.data._M_elems._32_5_ = 0;
    local_d8.data._M_elems[9]._1_3_ = 0;
    local_d8.exp = 0;
    local_d8.neg = false;
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&local_d8,(cpp_dec_float<50U,_int,_void> *)&local_158,&local_88);
    uVar9 = CONCAT35(local_d8.data._M_elems[9]._1_3_,local_d8.data._M_elems._32_5_);
    goto LAB_002b79ea;
  }
  if (iVar10 == 0) {
    return true;
  }
  local_a0 = pSVar3->theUbound;
  local_168 = pSVar3->theLbound;
  pIVar5 = (pSVar3->thevectors->set).theitem;
  local_98 = (long)nr;
  iVar10 = (pSVar3->thevectors->set).thekey[local_98].idx;
  local_d8.fpclass = cpp_dec_float_finite;
  local_d8.prec_elem = 10;
  local_d8.data._M_elems[0] = 0;
  local_d8.data._M_elems[1] = 0;
  local_d8.data._M_elems[2] = 0;
  local_d8.data._M_elems[3] = 0;
  local_d8.data._M_elems[4] = 0;
  local_d8.data._M_elems[5] = 0;
  local_d8.data._M_elems._24_5_ = 0;
  local_d8.data._M_elems[7]._1_3_ = 0;
  local_d8.data._M_elems._32_5_ = 0;
  local_d8.data._M_elems[9]._1_3_ = 0;
  local_d8.exp = 0;
  local_d8.neg = false;
  iVar2 = pIVar5[iVar10].data.
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .memused;
  if (iVar2 < 1) {
    fVar19 = cpp_dec_float_finite;
    iVar20 = 10;
  }
  else {
    pNVar11 = pIVar5[iVar10].data.
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .m_elem;
    uVar17 = iVar2 + 1;
    local_8c = nr;
    local_48 = this_00;
    local_40 = pUVar16;
    local_38 = this;
    do {
      pNVar8 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)((pUVar4->
                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + pNVar11->idx);
      local_158.val.m_backend.fpclass = cpp_dec_float_finite;
      local_158.val.m_backend.prec_elem = 10;
      local_158.val.m_backend.data._M_elems[0] = 0;
      local_158.val.m_backend.data._M_elems[1] = 0;
      local_158.val.m_backend.data._M_elems[2] = 0;
      local_158.val.m_backend.data._M_elems[3] = 0;
      local_158.val.m_backend.data._M_elems[4] = 0;
      local_158.val.m_backend.data._M_elems[5] = 0;
      local_158.val.m_backend.data._M_elems._24_5_ = 0;
      local_158.val.m_backend.data._M_elems[7]._1_3_ = 0;
      local_158.val.m_backend.data._M_elems._32_5_ = 0;
      local_158.val.m_backend.data._M_elems[9]._1_3_ = 0;
      local_158.val.m_backend.exp = 0;
      local_158.val.m_backend.neg = false;
      pNVar14 = pNVar11;
      if ((&local_158 != pNVar8) && (pNVar14 = pNVar8, pNVar11 != &local_158)) {
        uVar9 = *(undefined8 *)((pNVar11->val).m_backend.data._M_elems + 8);
        local_158.val.m_backend.data._M_elems._32_5_ = SUB85(uVar9,0);
        local_158.val.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar9 >> 0x28);
        local_158.val.m_backend.data._M_elems._0_8_ =
             *(undefined8 *)(pNVar11->val).m_backend.data._M_elems;
        local_158.val.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((pNVar11->val).m_backend.data._M_elems + 2);
        local_158.val.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((pNVar11->val).m_backend.data._M_elems + 4);
        uVar9 = *(undefined8 *)((pNVar11->val).m_backend.data._M_elems + 6);
        local_158.val.m_backend.data._M_elems._24_5_ = SUB85(uVar9,0);
        local_158.val.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar9 >> 0x28);
        local_158.val.m_backend.exp = (pNVar11->val).m_backend.exp;
        local_158.val.m_backend.neg = (pNVar11->val).m_backend.neg;
        local_158.val.m_backend.fpclass = (pNVar11->val).m_backend.fpclass;
        local_158.val.m_backend.prec_elem = (pNVar11->val).m_backend.prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                ((cpp_dec_float<50U,_int,_void> *)&local_158,
                 (cpp_dec_float<50U,_int,_void> *)pNVar14);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                (&local_d8,(cpp_dec_float<50U,_int,_void> *)&local_158);
      pNVar11 = pNVar11 + 1;
      uVar17 = uVar17 - 1;
    } while (1 < uVar17);
    fVar19 = local_d8.fpclass;
    iVar20 = local_d8.prec_elem;
    this_00 = local_48;
    pUVar16 = local_40;
    this = local_38;
    nr = local_8c;
  }
  lVar15 = local_98;
  local_158.val.m_backend.data._M_elems._32_5_ = local_d8.data._M_elems._32_5_;
  local_158.val.m_backend.data._M_elems[9]._1_3_ = local_d8.data._M_elems[9]._1_3_;
  local_158.val.m_backend.data._M_elems[4] = local_d8.data._M_elems[4];
  local_158.val.m_backend.data._M_elems[5] = local_d8.data._M_elems[5];
  local_158.val.m_backend.data._M_elems._24_5_ = local_d8.data._M_elems._24_5_;
  local_158.val.m_backend.data._M_elems[7]._1_3_ = local_d8.data._M_elems[7]._1_3_;
  local_158.val.m_backend.data._M_elems[0] = local_d8.data._M_elems[0];
  local_158.val.m_backend.data._M_elems[1] = local_d8.data._M_elems[1];
  local_158.val.m_backend.data._M_elems[2] = local_d8.data._M_elems[2];
  local_158.val.m_backend.data._M_elems[3] = local_d8.data._M_elems[3];
  pnVar13 = (pUVar16->
            super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  *(ulong *)((long)(pnVar13 + local_98) + 0x20) =
       CONCAT35(local_d8.data._M_elems[9]._1_3_,local_d8.data._M_elems._32_5_);
  *(undefined8 *)((long)(pnVar13 + local_98) + 0x10) = local_d8.data._M_elems._16_8_;
  *(ulong *)((long)(pnVar13 + local_98) + 0x18) =
       CONCAT35(local_d8.data._M_elems[7]._1_3_,local_d8.data._M_elems._24_5_);
  *(undefined8 *)&pnVar13[local_98].m_backend = local_d8.data._M_elems._0_8_;
  *(undefined8 *)((long)&pnVar13[local_98].m_backend + 8) = local_d8.data._M_elems._8_8_;
  *(int *)((long)(pnVar13 + local_98) + 0x28) = local_d8.exp;
  *(bool *)((long)(pnVar13 + local_98) + 0x2c) = local_d8.neg;
  *(ulong *)((long)(pnVar13 + local_98) + 0x30) = CONCAT44(iVar20,fVar19);
  pSVar3 = (this->
           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  if (0 < pSVar3->theRep *
          ((pSVar3->
           super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thedesc.stat)->data[local_98]) {
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::clearIdx(this_00,nr);
    return true;
  }
  pnVar13 = (pUVar16->
            super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_118.data._M_elems._32_5_ = SUB85(*(undefined8 *)((long)(pnVar13 + local_98) + 0x20),0);
  local_118.data._M_elems[9]._1_3_ =
       (undefined3)((ulong)*(undefined8 *)((long)(pnVar13 + local_98) + 0x20) >> 0x28);
  local_118.data._M_elems._0_8_ = *(undefined8 *)&pnVar13[local_98].m_backend;
  local_118.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar13[local_98].m_backend + 8);
  local_118.data._M_elems._16_8_ = *(undefined8 *)((long)(pnVar13 + local_98) + 0x10);
  uVar9 = *(undefined8 *)((long)(pnVar13 + local_98) + 0x18);
  local_118.data._M_elems._24_5_ = SUB85(uVar9,0);
  local_118.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar9 >> 0x28);
  local_118.exp = *(int *)((long)(pnVar13 + local_98) + 0x28);
  local_118.neg = *(bool *)((long)(pnVar13 + local_98) + 0x2c);
  local_118._48_8_ = *(undefined8 *)((long)(pnVar13 + local_98) + 0x30);
  pnVar6 = (pUVar16->thedelta).
           super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_88.exp = pnVar6[local_98].m_backend.exp;
  local_88.neg = pnVar6[local_98].m_backend.neg;
  local_88.fpclass = pnVar6[local_98].m_backend.fpclass;
  local_88.prec_elem = pnVar6[local_98].m_backend.prec_elem;
  local_88.data._M_elems._0_8_ = *(undefined8 *)&pnVar6[local_98].m_backend.data;
  local_88.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar6[local_98].m_backend.data + 8);
  puVar1 = (uint *)((long)&pnVar6[local_98].m_backend.data + 0x10);
  local_88.data._M_elems._16_8_ = *(undefined8 *)puVar1;
  uVar7 = *(undefined8 *)(puVar1 + 2);
  uVar9 = *(undefined8 *)((long)&pnVar6[local_98].m_backend.data + 0x20);
  local_88.data._M_elems._32_5_ = SUB85(uVar9,0);
  local_88.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar9 >> 0x28);
  local_88.data._M_elems._24_5_ = SUB85(uVar7,0);
  local_88.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
  if (local_88.fpclass == cpp_dec_float_NaN) {
LAB_002b76d3:
    pNVar14 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)(pnVar13 + lVar15);
    pNVar11 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)((local_a0->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar15);
    if (&local_158 != pNVar14) goto LAB_002b76fa;
LAB_002b7913:
    pVVar18 = local_a0;
    local_158.val.m_backend.fpclass = cpp_dec_float_finite;
    local_158.val.m_backend.prec_elem = 10;
    local_158.val.m_backend.neg = false;
    local_158.val.m_backend.exp = 0;
    local_158.val.m_backend.data._M_elems[9]._1_3_ = 0;
    local_158.val.m_backend.data._M_elems._32_5_ = 0;
    local_158.val.m_backend.data._M_elems[7]._1_3_ = 0;
    local_158.val.m_backend.data._M_elems._24_5_ = 0;
    local_158.val.m_backend.data._M_elems[4] = 0;
    local_158.val.m_backend.data._M_elems[5] = 0;
    local_158.val.m_backend.data._M_elems[2] = 0;
    local_158.val.m_backend.data._M_elems[3] = 0;
    local_158.val.m_backend.data._M_elems[0] = 0;
    local_158.val.m_backend.data._M_elems[1] = 0;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
              ((cpp_dec_float<50U,_int,_void> *)&local_158,(cpp_dec_float<50U,_int,_void> *)pNVar11)
    ;
    if (local_158.val.m_backend.data._M_elems[0] != 0 ||
        local_158.val.m_backend.fpclass != cpp_dec_float_finite) {
      local_158.val.m_backend.neg = (bool)(local_158.val.m_backend.neg ^ 1);
    }
  }
  else {
    local_d8.fpclass = cpp_dec_float_finite;
    local_d8.prec_elem = 10;
    local_d8.data._M_elems[0] = 0;
    local_d8.data._M_elems[1] = 0;
    local_d8.data._M_elems[2] = 0;
    local_d8.data._M_elems[3] = 0;
    local_d8.data._M_elems[4] = 0;
    local_d8.data._M_elems[5] = 0;
    local_d8.data._M_elems._24_5_ = 0;
    local_d8.data._M_elems[7]._1_3_ = 0;
    local_d8.data._M_elems._32_5_ = 0;
    local_d8.data._M_elems[9]._1_3_ = 0;
    local_d8.exp = 0;
    local_d8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_d8,0.0);
    iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       (&local_88,&local_d8);
    pnVar13 = (pUVar16->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (-1 < iVar10) goto LAB_002b76d3;
    pNVar14 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)(pnVar13 + lVar15);
    pNVar11 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)((local_168->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar15);
    if (&local_158 == pNVar14) goto LAB_002b7913;
LAB_002b76fa:
    pVVar18 = local_a0;
    local_158.val.m_backend.neg = false;
    local_158.val.m_backend.exp = 0;
    local_158.val.m_backend.data._M_elems[9]._1_3_ = 0;
    local_158.val.m_backend.data._M_elems._32_5_ = 0;
    local_158.val.m_backend.data._M_elems[7]._1_3_ = 0;
    local_158.val.m_backend.data._M_elems._24_5_ = 0;
    local_158.val.m_backend.fpclass = cpp_dec_float_finite;
    local_158.val.m_backend.prec_elem = 10;
    local_158.val.m_backend.data._M_elems[4] = 0;
    local_158.val.m_backend.data._M_elems[5] = 0;
    local_158.val.m_backend.data._M_elems[2] = 0;
    local_158.val.m_backend.data._M_elems[3] = 0;
    local_158.val.m_backend.data._M_elems[0] = 0;
    local_158.val.m_backend.data._M_elems[1] = 0;
    if (&local_158 != pNVar11) {
      uVar9 = *(undefined8 *)((long)(pNVar11->val).m_backend.data._M_elems + 0x20);
      local_158.val.m_backend.data._M_elems._32_5_ = SUB85(uVar9,0);
      local_158.val.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar9 >> 0x28);
      local_158.val.m_backend.data._M_elems._0_8_ =
           *(undefined8 *)(pNVar11->val).m_backend.data._M_elems;
      local_158.val.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((long)(pNVar11->val).m_backend.data._M_elems + 8);
      local_158.val.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((long)(pNVar11->val).m_backend.data._M_elems + 0x10);
      uVar9 = *(undefined8 *)((long)(pNVar11->val).m_backend.data._M_elems + 0x18);
      local_158.val.m_backend.data._M_elems._24_5_ = SUB85(uVar9,0);
      local_158.val.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar9 >> 0x28);
      local_158.val.m_backend.exp = *(int *)((long)&(pNVar11->val).m_backend + 0x28);
      local_158.val.m_backend.neg = *(bool *)((long)&(pNVar11->val).m_backend + 0x2c);
      local_158.val.m_backend._48_8_ = *(undefined8 *)((long)&(pNVar11->val).m_backend + 0x30);
    }
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
              ((cpp_dec_float<50U,_int,_void> *)&local_158,(cpp_dec_float<50U,_int,_void> *)pNVar14)
    ;
  }
  local_d8.fpclass = cpp_dec_float_finite;
  local_d8.prec_elem = 10;
  local_d8.data._M_elems[0] = 0;
  local_d8.data._M_elems[1] = 0;
  local_d8.data._M_elems[2] = 0;
  local_d8.data._M_elems[3] = 0;
  local_d8.data._M_elems[4] = 0;
  local_d8.data._M_elems[5] = 0;
  local_d8.data._M_elems._24_5_ = 0;
  local_d8.data._M_elems[7]._1_3_ = 0;
  local_d8.data._M_elems._32_5_ = 0;
  local_d8.data._M_elems[9]._1_3_ = 0;
  local_d8.exp = 0;
  local_d8.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&local_d8,(cpp_dec_float<50U,_int,_void> *)&local_158,&local_88);
  uVar9 = CONCAT35(local_d8.data._M_elems[9]._1_3_,local_d8.data._M_elems._32_5_);
  pcVar12 = local_e0;
LAB_002b79ea:
  lVar15 = local_98;
  *(undefined8 *)((pcVar12->data)._M_elems + 8) = uVar9;
  *(undefined8 *)((pcVar12->data)._M_elems + 4) = local_d8.data._M_elems._16_8_;
  *(ulong *)((pcVar12->data)._M_elems + 6) =
       CONCAT35(local_d8.data._M_elems[7]._1_3_,local_d8.data._M_elems._24_5_);
  *(undefined8 *)(pcVar12->data)._M_elems = local_d8.data._M_elems._0_8_;
  *(undefined8 *)((pcVar12->data)._M_elems + 2) = local_d8.data._M_elems._8_8_;
  pcVar12->exp = local_d8.exp;
  pcVar12->neg = local_d8.neg;
  pcVar12->fpclass = local_d8.fpclass;
  pcVar12->prec_elem = local_d8.prec_elem;
  pnVar13 = (pVVar18->val).
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (((pnVar13[local_98].m_backend.fpclass == cpp_dec_float_NaN) ||
      (pnVar6 = (local_168->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start,
      pnVar6[local_98].m_backend.fpclass == cpp_dec_float_NaN)) ||
     (iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         (&pnVar13[local_98].m_backend,&pnVar6[local_98].m_backend), iVar10 != 0)) {
    uVar9 = *(undefined8 *)((this->fastDelta).m_backend.data._M_elems + 8);
    local_158.val.m_backend.data._M_elems._32_5_ = SUB85(uVar9,0);
    local_158.val.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar9 >> 0x28);
    local_158.val.m_backend.data._M_elems._0_8_ =
         *(undefined8 *)(this->fastDelta).m_backend.data._M_elems;
    local_158.val.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((this->fastDelta).m_backend.data._M_elems + 2);
    local_158.val.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((this->fastDelta).m_backend.data._M_elems + 4);
    uVar9 = *(undefined8 *)((this->fastDelta).m_backend.data._M_elems + 6);
    local_158.val.m_backend.data._M_elems._24_5_ = SUB85(uVar9,0);
    local_158.val.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar9 >> 0x28);
    local_158.val.m_backend.exp = (this->fastDelta).m_backend.exp;
    local_158.val.m_backend.neg = (this->fastDelta).m_backend.neg;
    local_158.val.m_backend.fpclass = (this->fastDelta).m_backend.fpclass;
    local_158.val.m_backend.prec_elem = (this->fastDelta).m_backend.prec_elem;
    if (local_158.val.m_backend.fpclass != cpp_dec_float_finite ||
        local_158.val.m_backend.data._M_elems[0] != 0) {
      local_158.val.m_backend.neg = (bool)(local_158.val.m_backend.neg ^ 1);
    }
    local_d8.fpclass = cpp_dec_float_finite;
    local_d8.prec_elem = 10;
    local_d8.data._M_elems[0] = 0;
    local_d8.data._M_elems[1] = 0;
    local_d8.data._M_elems[2] = 0;
    local_d8.data._M_elems[3] = 0;
    local_d8.data._M_elems[4] = 0;
    local_d8.data._M_elems[5] = 0;
    local_d8.data._M_elems._24_5_ = 0;
    local_d8.data._M_elems[7]._1_3_ = 0;
    local_d8.data._M_elems._32_5_ = 0;
    local_d8.data._M_elems[9]._1_3_ = 0;
    local_d8.exp = 0;
    local_d8.neg = false;
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&local_d8,(cpp_dec_float<50U,_int,_void> *)&local_158,local_50);
    if (((pcVar12->fpclass != cpp_dec_float_NaN) && (local_d8.fpclass != cpp_dec_float_NaN)) &&
       ((iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (pcVar12,&local_d8), iVar10 < 0 &&
        (boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                   ((cpp_dec_float<50u,int,void> *)pcVar12,0.0), !polish)))) {
      if (local_88.fpclass != cpp_dec_float_NaN) {
        local_d8.fpclass = cpp_dec_float_finite;
        local_d8.prec_elem = 10;
        local_d8.data._M_elems[0] = 0;
        local_d8.data._M_elems[1] = 0;
        local_d8.data._M_elems[2] = 0;
        local_d8.data._M_elems[3] = 0;
        local_d8.data._M_elems[4] = 0;
        local_d8.data._M_elems[5] = 0;
        local_d8.data._M_elems._24_5_ = 0;
        local_d8.data._M_elems[7]._1_3_ = 0;
        local_d8.data._M_elems._32_5_ = 0;
        local_d8.data._M_elems[9]._1_3_ = 0;
        local_d8.exp = 0;
        local_d8.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_d8,0.0);
        iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_88,&local_d8);
        if (0 < iVar10) {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (&(((this->
                        super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).thesolver)->theShift).m_backend,
                     &(pVVar18->val).
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar15].m_backend);
          pnVar13 = (pVVar18->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          *(undefined8 *)&pnVar13[lVar15].m_backend.data = local_118.data._M_elems._0_8_;
          *(undefined8 *)((long)&pnVar13[lVar15].m_backend.data + 8) = local_118.data._M_elems._8_8_
          ;
          puVar1 = (uint *)((long)&pnVar13[lVar15].m_backend.data + 0x10);
          *(undefined8 *)puVar1 = local_118.data._M_elems._16_8_;
          *(ulong *)(puVar1 + 2) =
               CONCAT35(local_118.data._M_elems[7]._1_3_,local_118.data._M_elems._24_5_);
          *(ulong *)((long)&pnVar13[lVar15].m_backend.data + 0x20) =
               CONCAT35(local_118.data._M_elems[9]._1_3_,local_118.data._M_elems._32_5_);
          pnVar13[lVar15].m_backend.exp = local_118.exp;
          pnVar13[lVar15].m_backend.neg = local_118.neg;
          pnVar13[lVar15].m_backend.fpclass = local_118.fpclass;
          pnVar13[lVar15].m_backend.prec_elem = local_118.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                    (&(((this->
                        super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).thesolver)->theShift).m_backend,
                     &(pVVar18->val).
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar15].m_backend);
          return false;
        }
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                (&(((this->
                    super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).thesolver)->theShift).m_backend,
                 &(local_168->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar15].m_backend);
      pnVar13 = (local_168->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)&pnVar13[lVar15].m_backend.data = local_118.data._M_elems._0_8_;
      *(undefined8 *)((long)&pnVar13[lVar15].m_backend.data + 8) = local_118.data._M_elems._8_8_;
      puVar1 = (uint *)((long)&pnVar13[lVar15].m_backend.data + 0x10);
      *(undefined8 *)puVar1 = local_118.data._M_elems._16_8_;
      *(ulong *)(puVar1 + 2) =
           CONCAT35(local_118.data._M_elems[7]._1_3_,local_118.data._M_elems._24_5_);
      *(ulong *)((long)&pnVar13[lVar15].m_backend.data + 0x20) =
           CONCAT35(local_118.data._M_elems[9]._1_3_,local_118.data._M_elems._32_5_);
      pnVar13[lVar15].m_backend.exp = local_118.exp;
      pnVar13[lVar15].m_backend.neg = local_118.neg;
      pnVar13[lVar15].m_backend.fpclass = local_118.fpclass;
      pnVar13[lVar15].m_backend.prec_elem = local_118.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                (&(((this->
                    super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).thesolver)->theShift).m_backend,
                 &(local_168->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar15].m_backend);
    }
  }
  else {
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)pcVar12,0.0);
    if (!polish) {
      if (((local_118.fpclass == cpp_dec_float_NaN) ||
          (pnVar13 = (pVVar18->val).
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
          pnVar13[lVar15].m_backend.fpclass == cpp_dec_float_NaN)) ||
         (iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&local_118,&pnVar13[lVar15].m_backend), iVar10 < 1)) {
        pcVar12 = &(local_168->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar15].m_backend;
        local_d8.fpclass = cpp_dec_float_finite;
        local_d8.prec_elem = 10;
        local_d8.data._M_elems[0] = 0;
        local_d8.data._M_elems[1] = 0;
        local_d8.data._M_elems[2] = 0;
        local_d8.data._M_elems[3] = 0;
        local_d8.data._M_elems[4] = 0;
        local_d8.data._M_elems[5] = 0;
        local_d8.data._M_elems._24_5_ = 0;
        local_d8.data._M_elems[7]._1_3_ = 0;
        local_d8.data._M_elems._32_5_ = 0;
        local_d8.data._M_elems[9]._1_3_ = 0;
        local_d8.exp = 0;
        local_d8.neg = false;
        if (&local_d8 != pcVar12) {
          uVar9 = *(undefined8 *)((pcVar12->data)._M_elems + 8);
          local_d8.data._M_elems._32_5_ = SUB85(uVar9,0);
          local_d8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar9 >> 0x28);
          local_d8.data._M_elems._0_8_ = *(undefined8 *)(pcVar12->data)._M_elems;
          local_d8.data._M_elems._8_8_ = *(undefined8 *)((pcVar12->data)._M_elems + 2);
          local_d8.data._M_elems._16_8_ = *(undefined8 *)((pcVar12->data)._M_elems + 4);
          uVar9 = *(undefined8 *)((pcVar12->data)._M_elems + 6);
          local_d8.data._M_elems._24_5_ = SUB85(uVar9,0);
          local_d8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar9 >> 0x28);
          local_d8.exp = pcVar12->exp;
          local_d8.neg = pcVar12->neg;
          local_d8.fpclass = pcVar12->fpclass;
          local_d8.prec_elem = pcVar12->prec_elem;
        }
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  (&local_d8,&local_118);
        pSVar3 = (this->
                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thesolver;
      }
      else {
        pcVar12 = &(pVVar18->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar15].m_backend;
        local_d8.fpclass = cpp_dec_float_finite;
        local_d8.prec_elem = 10;
        local_d8.data._M_elems[0] = 0;
        local_d8.data._M_elems[1] = 0;
        local_d8.data._M_elems[2] = 0;
        local_d8.data._M_elems[3] = 0;
        local_d8.data._M_elems[4] = 0;
        local_d8.data._M_elems[5] = 0;
        local_d8.data._M_elems._24_5_ = 0;
        local_d8.data._M_elems[7]._1_3_ = 0;
        local_d8.data._M_elems._32_5_ = 0;
        local_d8.data._M_elems[9]._1_3_ = 0;
        local_d8.exp = 0;
        local_d8.neg = false;
        if (&local_d8 == pcVar12) {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (&local_d8,&local_118);
          if (local_d8.data._M_elems[0] != 0 || local_d8.fpclass != cpp_dec_float_finite) {
            local_d8.neg = (bool)(local_d8.neg ^ 1);
          }
        }
        else {
          local_d8.data._M_elems._32_5_ = local_118.data._M_elems._32_5_;
          local_d8.data._M_elems[9]._1_3_ = local_118.data._M_elems[9]._1_3_;
          local_d8.data._M_elems[4] = local_118.data._M_elems[4];
          local_d8.data._M_elems[5] = local_118.data._M_elems[5];
          local_d8.data._M_elems._24_5_ = local_118.data._M_elems._24_5_;
          local_d8.data._M_elems[7]._1_3_ = local_118.data._M_elems[7]._1_3_;
          local_d8.data._M_elems[0] = local_118.data._M_elems[0];
          local_d8.data._M_elems[1] = local_118.data._M_elems[1];
          local_d8.data._M_elems[2] = local_118.data._M_elems[2];
          local_d8.data._M_elems[3] = local_118.data._M_elems[3];
          local_d8.exp = local_118.exp;
          local_d8.neg = local_118.neg;
          local_d8.fpclass = local_118.fpclass;
          local_d8.prec_elem = local_118.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (&local_d8,pcVar12);
        }
        pSVar3 = (this->
                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thesolver;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                (&(pSVar3->theShift).m_backend,&local_d8);
      pnVar13 = (local_168->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      *(ulong *)((long)&pnVar13[lVar15].m_backend.data + 0x20) =
           CONCAT35(local_118.data._M_elems[9]._1_3_,local_118.data._M_elems._32_5_);
      puVar1 = (uint *)((long)&pnVar13[lVar15].m_backend.data + 0x10);
      *(undefined8 *)puVar1 = local_118.data._M_elems._16_8_;
      *(ulong *)(puVar1 + 2) =
           CONCAT35(local_118.data._M_elems[7]._1_3_,local_118.data._M_elems._24_5_);
      *(undefined8 *)&pnVar13[lVar15].m_backend.data = local_118.data._M_elems._0_8_;
      *(undefined8 *)((long)&pnVar13[lVar15].m_backend.data + 8) = local_118.data._M_elems._8_8_;
      pnVar13[lVar15].m_backend.exp = local_118.exp;
      pnVar13[lVar15].m_backend.neg = local_118.neg;
      pnVar13[lVar15].m_backend.fpclass = local_118.fpclass;
      pnVar13[lVar15].m_backend.prec_elem = local_118.prec_elem;
      pnVar6 = (pVVar18->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(ulong *)((long)&pnVar6[lVar15].m_backend.data + 0x20) =
           CONCAT35(local_118.data._M_elems[9]._1_3_,local_118.data._M_elems._32_5_);
      puVar1 = (uint *)((long)&pnVar6[lVar15].m_backend.data + 0x10);
      *(undefined8 *)puVar1 = local_118.data._M_elems._16_8_;
      *(ulong *)(puVar1 + 2) =
           CONCAT35(local_118.data._M_elems[7]._1_3_,local_118.data._M_elems._24_5_);
      *(undefined8 *)&pnVar6[lVar15].m_backend.data = local_118.data._M_elems._0_8_;
      *(undefined8 *)((long)&pnVar6[lVar15].m_backend.data + 8) = local_118.data._M_elems._8_8_;
      pnVar6[lVar15].m_backend.exp = pnVar13[lVar15].m_backend.exp;
      pnVar6[lVar15].m_backend.neg = pnVar13[lVar15].m_backend.neg;
      iVar20 = pnVar13[lVar15].m_backend.prec_elem;
      pnVar6[lVar15].m_backend.fpclass = pnVar13[lVar15].m_backend.fpclass;
      pnVar6[lVar15].m_backend.prec_elem = iVar20;
    }
  }
  return false;
}

Assistant:

bool SPxFastRT<R>::maxReEnter(R& sel,
                              R maxabs,
                              const SPxId& id,
                              int nr,
                              bool polish)
{
   R x, d;
   VectorBase<R>* up;
   VectorBase<R>* low;

   UpdateVector<R>& pvec = this->thesolver->pVec();
   SSVectorBase<R>& pupd = this->thesolver->pVec().delta();
   VectorBase<R>& upb = this->thesolver->upBound();
   VectorBase<R>& lpb = this->thesolver->lpBound();
   UpdateVector<R>& cvec = this->thesolver->coPvec();
   SSVectorBase<R>& cupd = this->thesolver->coPvec().delta();
   VectorBase<R>& ucb = this->thesolver->ucBound();
   VectorBase<R>& lcb = this->thesolver->lcBound();

   if(this->thesolver->isCoId(id))
   {
      if(this->thesolver->isCoBasic(nr))
      {
         cupd.clearIdx(nr);
         return true;
      }

      x = cvec[nr];
      d = cupd[nr];
      up = &ucb;
      low = &lcb;

      if(d < 0.0)
         sel = (lcb[nr] - cvec[nr]) / d;
      else
         sel = (ucb[nr] - cvec[nr]) / d;
   }
   else if(this->thesolver->isId(id))
   {
      pvec[nr] = this->thesolver->vector(nr) * cvec;

      if(this->thesolver->isBasic(nr))
      {
         pupd.clearIdx(nr);
         return true;
      }

      x = pvec[nr];
      d = pupd[nr];
      up = &upb;
      low = &lpb;

      if(d < 0.0)
         sel = (lpb[nr] - pvec[nr]) / d;
      else
         sel = (upb[nr] - pvec[nr]) / d;
   }
   else
      return true;

   if((*up)[nr] != (*low)[nr])
   {
      if(sel < -fastDelta / maxabs)
      {
         sel = 0.0;

         // prevent shifts in polishing mode to avoid a final cleanup step (i.e. simplex type switch)
         if(!polish)
         {
            if(d > 0.0)
            {
               this->thesolver->theShift -= (*up)[nr];
               (*up)[nr] = x;
               this->thesolver->theShift += (*up)[nr];
            }
            else
            {
               this->thesolver->theShift += (*low)[nr];
               (*low)[nr] = x;
               this->thesolver->theShift -= (*low)[nr];
            }
         }
      }
   }
   else
   {
      sel = 0.0;

      // prevent shifts in polishing mode to avoid a final cleanup step (i.e. simplex type switch)
      if(!polish)
      {
         if(x > (*up)[nr])
            this->thesolver->theShift += x - (*up)[nr];
         else
            this->thesolver->theShift += (*low)[nr] - x;

         (*up)[nr] = (*low)[nr] = x;
      }
   }

   return false;
}